

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeCluster *this_00;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *this_01;
  reference ppvVar2;
  uint uVar3;
  allocator_type local_41;
  BayesianGameWithClusterInfo *local_40;
  TypeCluster *tc;
  
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (&this->super_BayesianGameForDecPOMDPStage,pu);
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_005d85e8;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_005d8638
  ;
  (this->_m_pBG).px = (element_type *)0x0;
  (this->_m_pBG).pn.pi_ = (sp_counted_base *)0x0;
  this->_m_qJB = (QFunctionJointBeliefInterface *)0x0;
  this->_m_qHybrid = (QHybrid *)0x0;
  (this->_m_pBGJPol).px = (element_type *)0x0;
  (this->_m_pBGJPol).pn.pi_ = (sp_counted_base *)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])(pu);
  tc = (TypeCluster *)0x0;
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector(&this->_m_typeLists,CONCAT44(extraout_var,iVar1),(value_type *)&tc,&local_41);
  this->_m_thresholdJB = 0.0;
  this->_m_thresholdPjaoh = 0.0;
  local_40 = this;
  iVar1 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])(pu);
  for (uVar3 = 0; (ulong)uVar3 < CONCAT44(extraout_var_00,iVar1); uVar3 = uVar3 + 1) {
    this_00 = (TypeCluster *)operator_new(0x38);
    TypeCluster::TypeCluster(this_00,0);
    tc = this_00;
    this_01 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)operator_new(0x18);
    std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::vector
              (this_01,1,&tc,(allocator_type *)&local_41);
    ppvVar2 = std::
              vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
              ::at(&this->_m_typeLists,(ulong)uVar3);
    *ppvVar2 = this_01;
  }
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(                
        const PlanningUnitDecPOMDPDiscrete* pu
    )
        :
    BayesianGameForDecPOMDPStage(  pu )
    , _m_pBG()
    , _m_qJB(0)
    , _m_qHybrid(0)
    , _m_pBGJPol()
    , _m_typeLists(pu->GetNrAgents(), 0),
    _m_thresholdJB(0),
    _m_thresholdPjaoh(0)

{
    size_t nrAgents = pu->GetNrAgents();
    for(Index agI=0; agI < nrAgents; agI++)
    {
        //remember things are defined as follows:
        //typedef std::vector<TypeCluster* > TypeClusterList
        //std::vector< TypeClusterList* > _m_typeLists;
        Index typeIndex = 0;
        TypeCluster* tc = new TypeCluster( typeIndex );
        TypeClusterList* tcl =  new TypeClusterList(1, tc);
        _m_typeLists.at(agI) = tcl;
    }
}